

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

int AMPLSReportResults(AMPLS_MP_Solver *slv,char *solFileName)

{
  long *plVar1;
  size_t sVar2;
  long *local_48 [2];
  long local_38 [2];
  
  plVar1 = *slv->internal_info_;
  if (solFileName == (char *)0x0) {
    solFileName = "";
  }
  local_48[0] = local_38;
  sVar2 = strlen(solFileName);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,solFileName,solFileName + sVar2);
  std::__cxx11::string::_M_assign((string *)(plVar1 + 0x61));
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  (**(code **)(*plVar1 + 0x90))(plVar1);
  return 0;
}

Assistant:

int AMPLSReportResults(AMPLS_MP_Solver* slv, const char* solFileName = NULL) {
  return AMPLS__internal__TryCatchWrapper( slv, [=]() {
    auto be = AMPLSGetBackend(slv);
    // If solFileName is NULL, we scrap any previous override
    be->OverrideSolutionFile(solFileName == NULL ? "" : solFileName);
    be->ReportResults();
  } );
}